

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  u32 uVar4;
  ExprList *pEVar5;
  SrcList *pSVar6;
  Table *pTab;
  i16 *piVar7;
  undefined1 auVar8 [16];
  u8 uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  Vdbe *p;
  ulong uVar14;
  Expr *pEVar15;
  Expr *pLeft;
  CollSeq *pCVar16;
  char *zP4;
  char aff2;
  uint uVar17;
  int iVar18;
  Select *pSVar19;
  long lVar20;
  sqlite3 *psVar21;
  Op *pOVar22;
  int iVar23;
  ExprList_item *pEVar24;
  Index *pIdx;
  Schema **ppSVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ExprList_item *pEVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Walker local_60;
  
  iVar23 = pParse->nTab;
  pParse->nTab = iVar23 + 1;
  p = pParse->pVdbe;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar5 = ((pX->x).pSelect)->pEList;
    uVar17 = pEVar5->nExpr;
    if ((int)uVar17 < 1) {
      uVar12 = 0;
    }
    else {
      pEVar24 = pEVar5->a;
      uVar27 = 0;
      do {
        iVar11 = sqlite3ExprCanBeNull(pEVar24->pExpr);
        if (iVar11 != 0) goto LAB_00234539;
        uVar27 = uVar27 + 1;
        pEVar24 = pEVar24 + 1;
      } while (uVar17 != uVar27);
      uVar27 = (ulong)uVar17;
LAB_00234539:
      uVar12 = (uint)uVar27;
    }
    if (uVar12 == uVar17) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar19 = (pX->x).pSelect, pSVar19->pPrior == (Select *)0x0)) &&
       (((pSVar19->selFlags & 9) == 0 && (pSVar19->pLimit == (Expr *)0x0)))) &&
      ((pSVar19->pWhere == (Expr *)0x0 &&
       ((pSVar6 = pSVar19->pSrc, pSVar6->nSrc == 1 && (pSVar6->a[0].pSelect == (Select *)0x0))))))
     && (pTab = pSVar6->a[0].pTab, pTab->nModuleArg == 0)) {
    uVar17 = pSVar19->pEList->nExpr;
    uVar27 = (ulong)uVar17;
    pEVar24 = pSVar19->pEList->a;
    if (0 < (int)uVar17) {
      lVar20 = 0;
      do {
        if (**(char **)((long)&pEVar24->pExpr + lVar20) != -0x68) goto LAB_002345ba;
        lVar20 = lVar20 + 0x20;
      } while (uVar27 << 5 != lVar20);
    }
    psVar21 = pParse->db;
    if (pTab->pSchema == (Schema *)0x0) {
      uVar28 = 0xfff0bdc0;
    }
    else {
      uVar12 = psVar21->nDb;
      if ((int)uVar12 < 1) {
        uVar28 = 0;
      }
      else {
        ppSVar25 = &psVar21->aDb->pSchema;
        uVar14 = 0;
        do {
          uVar28 = uVar14;
          if (*ppSVar25 == pTab->pSchema) break;
          uVar14 = uVar14 + 1;
          ppSVar25 = ppSVar25 + 4;
          uVar28 = (ulong)uVar12;
        } while (uVar12 != uVar14);
      }
    }
    iVar11 = (int)(short)uVar28;
    sqlite3CodeVerifySchema(pParse,iVar11);
    sqlite3TableLock(pParse,iVar11,pTab->tnum,'\0',pTab->zName);
    if (uVar17 != 1) {
      if (0 < (int)uVar17) goto LAB_002348f8;
LAB_0023497a:
      pIdx = pTab->pIndex;
      if (pIdx != (Index *)0x0) {
        do {
          uVar2 = pIdx->nColumn;
          if (((uVar2 < 0x3f) && ((int)uVar17 <= (int)(uint)uVar2)) &&
             (((inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar17 &&
               ((uVar2 <= uVar17 || (pIdx->onError != '\0')))))))) {
            if ((int)uVar17 < 1) {
              uVar28 = 0;
            }
            else {
              uVar14 = 0;
              uVar28 = 0;
              do {
                pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar14);
                pEVar15 = pEVar24[uVar14].pExpr;
                pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar15);
                piVar7 = pIdx->aiColumn;
                sVar3 = pEVar15->iColumn;
                uVar29 = 0;
                while ((piVar7[uVar29] != sVar3 ||
                       ((pCVar16 != (CollSeq *)0x0 &&
                        (iVar13 = sqlite3StrICmp(pCVar16->zName,pIdx->azColl[uVar29]), iVar13 != 0))
                       ))) {
                  uVar29 = uVar29 + 1;
                  if (uVar27 == uVar29) goto LAB_00234ae9;
                }
                if ((uVar17 == (uint)uVar29) || ((uVar28 >> (uVar29 & 0x3f) & 1) != 0)) break;
                if (aiMap != (int *)0x0) {
                  aiMap[uVar14] = (uint)uVar29;
                }
                uVar28 = uVar28 | 1L << ((byte)uVar29 & 0x3f);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar27);
            }
LAB_00234ae9:
            if ((uVar28 ^ -1L << ((byte)uVar17 & 0x3f)) == 0xffffffffffffffff) {
              iVar13 = sqlite3VdbeAddOp3(p,0x14,0,0,0);
              zP4 = sqlite3MPrintf(psVar21,"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              iVar26 = sqlite3VdbeAddOp3(p,0xa7,0,0,0);
              sqlite3VdbeChangeP4(p,iVar26,zP4,-7);
              sqlite3VdbeAddOp3(p,0x68,iVar23,pIdx->tnum,iVar11);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar1 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar11 = pParse->nMem + 1;
                pParse->nMem = iVar11;
                *prRhsHasNull = iVar11;
                if (uVar17 == 1) {
                  sqlite3SetHasNullFlag(p,iVar23,iVar11);
                }
              }
              iVar26 = bVar1 + 3;
              iVar11 = p->nOp;
              psVar21 = p->db;
              goto LAB_00234bd5;
            }
          }
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      goto LAB_002345ba;
    }
    if (-1 < pEVar24->pExpr->iColumn) {
LAB_002348f8:
      uVar28 = 0;
      pEVar30 = pEVar24;
      do {
        pEVar15 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar28);
        lVar20 = (long)pEVar30->pExpr->iColumn;
        if (lVar20 < 0) {
          aff2 = 'D';
        }
        else {
          aff2 = pTab->aCol[lVar20].affinity;
        }
        cVar10 = sqlite3CompareAffinity(pEVar15,aff2);
        bVar31 = (byte)(cVar10 + 0xbfU) < 2;
        uVar28 = uVar28 + 1;
      } while ((uVar28 < uVar27) && (pEVar30 = pEVar30 + 1, 'B' < aff2 || bVar31));
      if ('B' >= aff2 && !bVar31) goto LAB_002345ba;
      goto LAB_0023497a;
    }
    iVar13 = sqlite3VdbeAddOp3(p,0x14,0,0,0);
    sqlite3OpenTable(pParse,iVar23,iVar11,pTab,0x68);
    iVar11 = p->nOp;
    psVar21 = p->db;
    iVar26 = 1;
LAB_00234bd5:
    if (psVar21->mallocFailed == '\0') {
      iVar18 = iVar11 + -1;
      if (-1 < iVar13) {
        iVar18 = iVar13;
      }
      pOVar22 = p->aOp + iVar18;
    }
    else {
      pOVar22 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar22->p2 = iVar11;
LAB_00234634:
    pX->iTable = iVar23;
  }
  else {
LAB_002345ba:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
      pEVar15 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_60.eCode = '\x01';
      local_60.xExprCallback = exprNodeIsConstant;
      local_60.xSelectCallback = selectNodeIsConstant;
      local_60.u.n = 0;
      walkExpr(&local_60,pX);
      pX->pLeft = pEVar15;
      iVar26 = 5;
      if ((local_60.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) goto LAB_00234634;
    }
    uVar4 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar26 = 2;
      uVar17 = 0;
      if (prRhsHasNull == (int *)0x0) {
        iVar23 = 0;
      }
      else {
        iVar23 = pParse->nMem + 1;
        pParse->nMem = iVar23;
        *prRhsHasNull = iVar23;
        uVar17 = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar26 = 2;
      iVar23 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar12 = pX->flags & 0x800;
        uVar17 = uVar12 >> 0xb ^ 1;
        iVar26 = 2 - (uint)(uVar12 == 0);
      }
      else {
        uVar17 = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar23,uVar17);
    pParse->nQueryLoop = uVar4;
  }
  auVar8 = _DAT_00264660;
  if (aiMap == (int *)0x0) {
    return iVar26;
  }
  if (0xfffffffd < iVar26 - 5U) {
    return iVar26;
  }
  pEVar15 = pX->pLeft;
  uVar9 = pEVar15->op;
  if (uVar9 == 0x9d) {
    uVar9 = pEVar15->op2;
  }
  if (uVar9 == 'w') {
    pSVar19 = (pEVar15->x).pSelect;
  }
  else {
    uVar17 = 1;
    if (uVar9 != 0x9e) goto LAB_0023470e;
    pSVar19 = (Select *)&pEVar15->x;
  }
  uVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar19->pEList)->pList->nExpr;
  if ((int)uVar17 < 1) {
    return iVar26;
  }
LAB_0023470e:
  lVar20 = (ulong)uVar17 - 1;
  auVar32._8_4_ = (int)lVar20;
  auVar32._0_8_ = lVar20;
  auVar32._12_4_ = (int)((ulong)lVar20 >> 0x20);
  uVar27 = 0;
  auVar32 = auVar32 ^ _DAT_00264660;
  auVar33 = _DAT_00264650;
  do {
    auVar34 = auVar33 ^ auVar8;
    if ((bool)(~(auVar34._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar34._0_4_ ||
                auVar32._4_4_ < auVar34._4_4_) & 1)) {
      aiMap[uVar27] = (int)uVar27;
    }
    if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
        auVar34._12_4_ <= auVar32._12_4_) {
      aiMap[uVar27 + 1] = (int)uVar27 + 1;
    }
    uVar27 = uVar27 + 2;
    lVar20 = auVar33._8_8_;
    auVar33._0_8_ = auVar33._0_8_ + 2;
    auVar33._8_8_ = lVar20 + 2;
  } while ((uVar17 + 1 & 0xfffffffe) != uVar27);
  return iVar26;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap                 /* Mapping from Index fields to RHS fields */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
#ifndef SQLITE_OMIT_EXPLAIN
            sqlite3VdbeAddOp4(v, OP_Explain, 0, 0, 0,
              sqlite3MPrintf(db, "USING INDEX %s FOR IN-OPERATOR",pIdx->zName),
              P4_DYNAMIC);
#endif
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  return eType;
}